

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O2

ostream * test_detail::
          print_range<std::deque<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>
                    (ostream *stream,long range)

{
  ostream *poVar1;
  anon_class_16_2_aa65ec36 __f;
  identity_fn local_79;
  _Deque_iterator<unsigned_int,_const_unsigned_int_&,_const_unsigned_int_*> local_78;
  _Deque_iterator<unsigned_int,_const_unsigned_int_&,_const_unsigned_int_*> local_58;
  _Deque_iterator<unsigned_int,_const_unsigned_int_&,_const_unsigned_int_*> local_38;
  
  std::operator<<(stream,"[");
  if (*(long *)(range + 0x10) != *(long *)(range + 0x30)) {
    std::ostream::_M_insert<unsigned_long>((ulong)stream);
    local_58._M_cur = *(_Elt_pointer *)(range + 0x10);
    local_58._M_first = *(_Elt_pointer *)(range + 0x18);
    local_58._M_last = *(_Elt_pointer *)(range + 0x20);
    local_58._M_node = *(_Map_pointer *)(range + 0x28);
    std::next<std::_Deque_iterator<unsigned_int,unsigned_int_const&,unsigned_int_const*>>
              (&local_38,&local_58,1);
    local_78._M_cur = *(_Elt_pointer *)(range + 0x30);
    local_78._M_first = *(_Elt_pointer *)(range + 0x38);
    local_78._M_last = *(_Elt_pointer *)(range + 0x40);
    local_78._M_node = *(_Map_pointer *)(range + 0x48);
    __f.proj = &local_79;
    __f.stream = stream;
    std::
    for_each<std::_Deque_iterator<unsigned_int,unsigned_int_const&,unsigned_int_const*>,test_detail::print_range<std::deque<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>(std::ostream&,std::deque<unsigned_int,std::allocator<unsigned_int>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              (&local_38,&local_78,__f);
  }
  poVar1 = std::operator<<(stream,"]");
  return poVar1;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }